

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

size_t __thiscall adios2::Engine::CurrentStep(Engine *this)

{
  Engine *pointer;
  size_t sVar1;
  allocator local_39;
  string local_38;
  
  pointer = this->m_Engine;
  std::__cxx11::string::string((string *)&local_38,"in call to Engine::CurrentStep",&local_39);
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sVar1 = (**(code **)(*(long *)this->m_Engine + 0x20))();
  return sVar1;
}

Assistant:

size_t Engine::CurrentStep() const
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::CurrentStep");
    return m_Engine->CurrentStep();
}